

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_msg.c
# Opt level: O0

char * p2sc_backtrace(void)

{
  int iVar1;
  void *__ptr;
  char *pcVar2;
  char *ret;
  char **strs;
  int frames;
  void *stack [129];
  undefined1 local_408 [1032];
  
  iVar1 = backtrace(local_408,0x80);
  __ptr = (void *)backtrace_symbols(local_408,iVar1);
  *(undefined8 *)((long)__ptr + (long)iVar1 * 8) = 0;
  pcVar2 = (char *)g_strjoinv("\n\t",__ptr);
  free(__ptr);
  return pcVar2;
}

Assistant:

static char *p2sc_backtrace(void) {
#ifdef HAVE_BACKTRACE

#define BT_DEPTH 128

    void *stack[BT_DEPTH + 1];
    int frames = backtrace(stack, BT_DEPTH);
    char **strs = backtrace_symbols(stack, frames), *ret;

    strs[frames] = NULL;
    ret = g_strjoinv("\n\t", strs);
    free(strs);

    return ret;
#endif
    return NULL;
}